

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mouse_cursor.c
# Opt level: O0

_Bool al_set_mouse_cursor(ALLEGRO_DISPLAY *display,ALLEGRO_MOUSE_CURSOR *cursor)

{
  byte bVar1;
  long in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    bVar1 = (**(code **)(*(long *)(in_RDI + 0x80) + 0xa8))(in_RDI,in_RSI);
    local_1 = (_Bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool al_set_mouse_cursor(ALLEGRO_DISPLAY *display, ALLEGRO_MOUSE_CURSOR *cursor)
{
   if (!cursor) {
      return false;
   }

   if (display) {
      ASSERT(display->vt->set_mouse_cursor);
      return display->vt->set_mouse_cursor(display, cursor);
   }

   return false;
}